

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O2

int __thiscall nuraft::peer::shutdown(peer *this,int __fd,int __how)

{
  int extraout_EAX;
  
  LOCK();
  (this->abandoned_)._M_base._M_i = true;
  UNLOCK();
  std::__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>);
  std::mutex::lock(&this->rpc_protector_);
  std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
  std::__shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->hb_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>)
  ;
  return extraout_EAX;
}

Assistant:

void peer::shutdown() {
    // Should set the flag to block all incoming requests.
    abandoned_ = true;

    // Cut off all shared pointers related to ASIO and Raft server.
    scheduler_.reset();
    {   // To guarantee atomic reset
        // (race between send_req()).
        std::lock_guard<std::mutex> l(rpc_protector_);
        rpc_.reset();
    }
    hb_task_.reset();
}